

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

_Bool get_trap_graphics(chunk *c,grid_data *g,int *a,wchar_t *w)

{
  _Bool _Var1;
  wchar_t *w_local;
  int *a_local;
  grid_data *g_local;
  chunk *c_local;
  
  _Var1 = flag_has_dbg(g->trap->flags,3,3,"g->trap->flags","TRF_VISIBLE");
  if ((((_Var1) || (_Var1 = flag_has_dbg(g->trap->flags,3,1,"g->trap->flags","TRF_GLYPH"), _Var1))
      || (_Var1 = flag_has_dbg(g->trap->flags,3,0x10,"g->trap->flags","TRF_M_TRAP"), _Var1)) ||
     (_Var1 = flag_has_dbg(g->trap->flags,3,0xf,"g->trap->flags","TRF_WEB"), _Var1)) {
    *a = (uint)trap_x_attr[g->lighting][g->trap->kind->tidx];
    *w = trap_x_char[g->lighting][g->trap->kind->tidx];
  }
  _Var1 = flag_has_dbg(g->trap->flags,3,0xf,"g->trap->flags","TRF_WEB");
  return _Var1;
}

Assistant:

static bool get_trap_graphics(struct chunk *c, struct grid_data *g, int *a,
							  wchar_t *w)
{
    /* Trap is visible */
    if (trf_has(g->trap->flags, TRF_VISIBLE) ||
		trf_has(g->trap->flags, TRF_GLYPH) ||
		trf_has(g->trap->flags, TRF_M_TRAP) ||
		trf_has(g->trap->flags, TRF_WEB)) {
		/* Get the graphics */
		*a = trap_x_attr[g->lighting][g->trap->kind->tidx];
		*w = trap_x_char[g->lighting][g->trap->kind->tidx];
    }

	return trf_has(g->trap->flags, TRF_WEB);
}